

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::invalidateFramebuffer
          (ReferenceContext *this,deUint32 target,int numAttachments,deUint32 *attachments)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ConstPixelBufferAccess *pCVar4;
  int height;
  int width;
  undefined1 local_e8 [8];
  MultisampleConstPixelBufferAccess stencilBuf;
  undefined1 local_98 [8];
  MultisampleConstPixelBufferAccess depthBuf;
  undefined1 local_48 [8];
  MultisampleConstPixelBufferAccess colorBuf0;
  deUint32 *attachments_local;
  int numAttachments_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  colorBuf0.m_access.m_data = attachments;
  getDrawColorbuffer((MultisamplePixelBufferAccess *)&depthBuf.m_access.m_data,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_48,
             (MultisamplePixelBufferAccess *)&depthBuf.m_access.m_data);
  getDrawDepthbuffer((MultisamplePixelBufferAccess *)&stencilBuf.m_access.m_data,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_98,
             (MultisamplePixelBufferAccess *)&stencilBuf.m_access.m_data);
  getDrawStencilbuffer((MultisamplePixelBufferAccess *)&height,this);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)local_e8,(MultisamplePixelBufferAccess *)&height);
  pCVar4 = rr::MultisampleConstPixelBufferAccess::raw((MultisampleConstPixelBufferAccess *)local_48)
  ;
  iVar1 = tcu::ConstPixelBufferAccess::getHeight(pCVar4);
  iVar1 = de::max<int>(0,iVar1);
  pCVar4 = rr::MultisampleConstPixelBufferAccess::raw((MultisampleConstPixelBufferAccess *)local_98)
  ;
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(pCVar4);
  iVar1 = de::max<int>(iVar1,iVar2);
  pCVar4 = rr::MultisampleConstPixelBufferAccess::raw((MultisampleConstPixelBufferAccess *)local_e8)
  ;
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(pCVar4);
  iVar1 = de::max<int>(iVar1,iVar2);
  pCVar4 = rr::MultisampleConstPixelBufferAccess::raw((MultisampleConstPixelBufferAccess *)local_48)
  ;
  iVar2 = tcu::ConstPixelBufferAccess::getDepth(pCVar4);
  iVar2 = de::max<int>(0,iVar2);
  pCVar4 = rr::MultisampleConstPixelBufferAccess::raw((MultisampleConstPixelBufferAccess *)local_98)
  ;
  iVar3 = tcu::ConstPixelBufferAccess::getDepth(pCVar4);
  iVar2 = de::max<int>(iVar2,iVar3);
  pCVar4 = rr::MultisampleConstPixelBufferAccess::raw((MultisampleConstPixelBufferAccess *)local_e8)
  ;
  iVar3 = tcu::ConstPixelBufferAccess::getDepth(pCVar4);
  iVar2 = de::max<int>(iVar2,iVar3);
  (*(this->super_Context)._vptr_Context[0x49])
            (this,(ulong)target,(ulong)(uint)numAttachments,colorBuf0.m_access.m_data,0,0,iVar1,
             iVar2);
  return;
}

Assistant:

void ReferenceContext::invalidateFramebuffer (deUint32 target, int numAttachments, const deUint32* attachments)
{
	// \todo [2012-07-17 pyry] Support multiple color attachments.
	rr::MultisampleConstPixelBufferAccess	colorBuf0	= getDrawColorbuffer();
	rr::MultisampleConstPixelBufferAccess	depthBuf	= getDrawDepthbuffer();
	rr::MultisampleConstPixelBufferAccess	stencilBuf	= getDrawStencilbuffer();
	int										width		= 0;
	int										height		= 0;

	width = de::max(width, colorBuf0.raw().getHeight());
	width = de::max(width, depthBuf.raw().getHeight());
	width = de::max(width, stencilBuf.raw().getHeight());

	height = de::max(height, colorBuf0.raw().getDepth());
	height = de::max(height, depthBuf.raw().getDepth());
	height = de::max(height, stencilBuf.raw().getDepth());

	invalidateSubFramebuffer(target, numAttachments, attachments, 0, 0, width, height);
}